

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O0

void __thiscall
wallet::COutput::COutput
          (COutput *this,COutPoint *outpoint,CTxOut *txout,int depth,int input_bytes,bool spendable,
          bool solvable,bool safe,int64_t time,bool from_me,CAmount fees)

{
  optional<CFeeRate> feerate;
  undefined4 in_ECX;
  CTxOut *in_RDX;
  uint uVar1;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  byte in_stack_00000010;
  COutput *in_stack_00000018;
  long in_stack_00000028;
  undefined4 in_stack_ffffffffffffff04;
  bool local_ba;
  int iVar2;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  int64_t in_stack_ffffffffffffffd0;
  _Storage<CFeeRate,_true> in_stack_ffffffffffffffe0;
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = in_R8D;
  std::optional<CFeeRate>::optional((optional<CFeeRate> *)&stack0xffffffffffffffd8);
  uVar1 = (uint)(in_stack_00000010 & 1);
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._8_8_ = lVar3;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload = in_stack_ffffffffffffffe0;
  COutput(in_stack_00000018,(COutPoint *)CONCAT44(iVar2,in_ECX),in_RDX,(int)((ulong)in_RSI >> 0x20),
          (int)in_RSI,SUB81((ulong)in_RDI >> 0x38,0),SUB81((ulong)in_RDI >> 0x30,0),
          SUB81((ulong)in_RDI >> 0x28,0),in_stack_ffffffffffffffd0,SUB81((ulong)in_RDI >> 0x20,0),
          feerate);
  if ((-1 < in_R8D) || (local_ba = true, in_stack_00000028 != 0)) {
    local_ba = 0 < in_R8D && -1 < in_stack_00000028;
  }
  if (!local_ba) {
    __assert_fail("(input_bytes < 0 && fees == 0) || (input_bytes > 0 && fees >= 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
                  ,100,
                  "wallet::COutput::COutput(const COutPoint &, const CTxOut &, int, int, bool, bool, bool, int64_t, bool, const CAmount)"
                 );
  }
  std::optional<long>::optional<const_long_&,_true>
            (&in_stack_00000018->effective_value,(long *)CONCAT44(in_stack_ffffffffffffff04,uVar1));
  *(undefined8 *)(in_RDI + 4) = local_38;
  *(int64_t *)(in_RDI + 6) = in_stack_ffffffffffffffd0;
  std::optional<long>::value(&in_stack_00000018->effective_value);
  std::optional<long>::optional<long,_true>
            (&in_stack_00000018->effective_value,(long *)CONCAT44(in_stack_ffffffffffffff04,uVar1));
  *in_RDI = local_48;
  in_RDI[1] = uStack_44;
  in_RDI[2] = uStack_40;
  in_RDI[3] = uStack_3c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

COutput(const COutPoint& outpoint, const CTxOut& txout, int depth, int input_bytes, bool spendable, bool solvable, bool safe, int64_t time, bool from_me, const CAmount fees)
        : COutput(outpoint, txout, depth, input_bytes, spendable, solvable, safe, time, from_me)
    {
        // if input_bytes is unknown, then fees should be 0, if input_bytes is known, then the fees should be a positive integer or 0 (input_bytes known and fees = 0 only happens in the tests)
        assert((input_bytes < 0 && fees == 0) || (input_bytes > 0 && fees >= 0));
        fee = fees;
        effective_value = txout.nValue - fee.value();
    }